

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O0

void __thiscall
cmInstalledFile::AppendProperty
          (cmInstalledFile *this,cmMakefile *mf,string *prop,char *value,bool param_4)

{
  Entry **__return_storage_ptr__;
  mapped_type *this_00;
  cmCompiledGeneratorExpression *local_90;
  mapped_type *local_88;
  Property *property;
  undefined1 local_70 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  bool param_4_local;
  char *value_local;
  string *prop_local;
  cmMakefile *mf_local;
  cmInstalledFile *this_local;
  
  __return_storage_ptr__ = &ge.Backtrace.Cur;
  cmMakefile::GetBacktrace((cmListFileBacktrace *)__return_storage_ptr__,mf);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_70,(cmListFileBacktrace *)__return_storage_ptr__);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
            ::operator[](&this->Properties,prop);
  local_88 = this_00;
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&stack0xffffffffffffff68,local_70);
  local_90 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::release
                       ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xffffffffffffff68);
  std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>::
  push_back(&this_00->ValueExpressions,&stack0xffffffffffffff70);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xffffffffffffff68);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_70);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge.Backtrace.Cur);
  return;
}

Assistant:

void cmInstalledFile::AppendProperty(cmMakefile const* mf,
                                     const std::string& prop,
                                     const char* value, bool /*asString*/)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(backtrace);

  Property& property = this->Properties[prop];
  property.ValueExpressions.push_back(ge.Parse(value).release());
}